

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

void initial_load_test_nested_common_prefix(void)

{
  int iVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  size_t sVar4;
  filemgr_open_result fVar5;
  initial_load_elem *ile_1;
  list_elem *le;
  uint8_t valuebuf [8];
  size_t jj_1;
  size_t ii_1;
  hbtrie trie;
  initial_load_elem *ile;
  size_t jj;
  size_t ii;
  list entries;
  btreeblk_handle bhandle;
  docio_handle dhandle;
  filemgr *file;
  filemgr_open_result result;
  filemgr_config config;
  docio_object doc;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  int rr;
  hbtrie_result r;
  char body [256];
  char meta [256];
  char dockey [256];
  uint32_t docsize;
  uint64_t _offset;
  uint64_t offset;
  int blocksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  docio_object *in_stack_fffffffffffff6d8;
  docio_handle *in_stack_fffffffffffff6e0;
  err_log_callback *log_callback;
  filemgr *in_stack_fffffffffffff6e8;
  code *handle;
  filemgr *in_stack_fffffffffffff6f0;
  filemgr *file_00;
  docio_handle *in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  hbtrie *in_stack_fffffffffffff720;
  char *rawkey;
  btree_blk_ops *in_stack_fffffffffffff730;
  void *in_stack_fffffffffffff738;
  hbtrie_func_readkey *in_stack_fffffffffffff740;
  uint64_t in_stack_fffffffffffff748;
  ulong uVar6;
  hbtrie_load_get_next_entry *in_stack_fffffffffffff750;
  ulong uVar7;
  hbtrie_load_get_kv_from_entry *in_stack_fffffffffffff758;
  hbtrie_load_btreeblk_end *in_stack_fffffffffffff760;
  void *in_stack_fffffffffffff768;
  ulong local_830;
  ulong local_828;
  undefined1 local_820 [7];
  undefined1 in_stack_fffffffffffff7e7;
  docio_object *in_stack_fffffffffffff7e8;
  uint64_t in_stack_fffffffffffff7f0;
  docio_handle *in_stack_fffffffffffff7f8;
  err_log_callback local_798 [2];
  filemgr *local_758;
  filemgr *local_750;
  int local_748;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined1 local_730;
  undefined2 local_720;
  ushort local_6e0;
  ushort local_6de;
  uint local_6dc;
  undefined1 *local_6c8;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  undefined1 local_6a8 [256];
  undefined1 local_5a8 [64];
  err_log_callback *in_stack_fffffffffffffa98;
  filemgr_config *in_stack_fffffffffffffaa0;
  filemgr_ops *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  undefined1 local_4a8 [264];
  int local_3a0;
  hbtrie_result local_39c;
  char local_398 [184];
  err_log_callback *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd37;
  filemgr *in_stack_fffffffffffffd38;
  char local_298 [256];
  char local_198 [268];
  uint32_t local_8c;
  list_elem *local_88;
  bid_t local_80;
  undefined4 local_74;
  __time_t local_50;
  __suseconds_t local_48;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  local_50 = local_30.tv_sec;
  local_48 = local_30.tv_usec;
  local_74 = 0x1000;
  local_3a0 = system("rm -rf  hbtrie_testfile");
  docio_object::docio_object((docio_object *)in_stack_fffffffffffff6e0);
  memset(&local_6e0,0,0x38);
  local_6c8 = local_4a8;
  local_6b8 = local_5a8;
  local_6b0 = local_6a8;
  memset(&local_740,0,0x60);
  local_740 = local_74;
  local_73c = 0;
  local_738 = 0;
  local_730 = 8;
  local_734 = 8;
  local_720 = 8;
  get_filemgr_ops();
  fVar5 = filemgr_open(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0
                       ,in_stack_fffffffffffffa98);
  local_758 = fVar5.file;
  local_748 = fVar5.rv;
  local_750 = local_758;
  docio_init(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
             SUB81((ulong)in_stack_fffffffffffff6e8 >> 0x38,0));
  btreeblk_init((btreeblk_handle *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                (uint32_t)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
  list_init((list *)local_820);
  local_828 = 0;
  do {
    if (9 < local_828) {
      btreeblk_get_ops();
      log_callback = local_798;
      handle = _readkey_wrap;
      file_00 = (filemgr *)0x2710;
      hbtrie_init_and_load
                (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,in_stack_fffffffffffff718,
                 (int)((ulong)local_820 >> 0x20),0x10b1e0,initial_load_get,in_stack_fffffffffffff730
                 ,in_stack_fffffffffffff738,in_stack_fffffffffffff740,in_stack_fffffffffffff748,
                 in_stack_fffffffffffff750,in_stack_fffffffffffff758,in_stack_fffffffffffff760,
                 in_stack_fffffffffffff768);
      filemgr_commit(file_00,SUB81((ulong)handle >> 0x38,0),log_callback);
      printf("trie root bid %lu\n",in_stack_fffffffffffff760);
      uVar7 = 0;
      do {
        if (9 < uVar7) {
          hbtrie_free((hbtrie *)0x10c52d);
          docio_free((docio_handle *)0x10c53a);
          btreeblk_free((btreeblk_handle *)file_00);
          filemgr_close(in_stack_fffffffffffffd38,(bool)in_stack_fffffffffffffd37,
                        in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
          filemgr_shutdown();
          plVar2 = list_begin((list *)local_820);
          while (plVar2 != (list_elem *)0x0) {
            plVar3 = list_next(plVar2);
            free(plVar2[1].prev);
            free(plVar2);
            plVar2 = plVar3;
          }
          if (initial_load_test_nested_common_prefix::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","initial load with nested common prefix test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","initial load with nested common prefix test");
          }
          return;
        }
        for (uVar6 = 0; uVar6 < 1000; uVar6 = uVar6 + 1) {
          sprintf(local_198,"00000000%08zu%08zuabc",uVar7,uVar6);
          sprintf(local_298,"metadata_%03zu",uVar6);
          sprintf(local_398,"body_%03zu",uVar6);
          rawkey = local_198;
          sVar4 = strlen(local_198);
          local_39c = hbtrie_find((hbtrie *)&stack0xfffffffffffff758,rawkey,(int)sVar4,
                                  &stack0xfffffffffffff740);
          btreeblk_end((btreeblk_handle *)handle);
          if (local_39c == HBTRIE_RESULT_FAIL) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x4d6);
            initial_load_test_nested_common_prefix::__test_pass = 0;
            if (local_39c == HBTRIE_RESULT_FAIL) {
              __assert_fail("r != HBTRIE_RESULT_FAIL",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x4d6,"void initial_load_test_nested_common_prefix()");
            }
          }
          if (local_39c != HBTRIE_RESULT_FAIL) {
            local_88 = (list_elem *)
                       ((ulong)in_stack_fffffffffffff740 >> 0x38 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff000000000000) >> 0x28 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff0000000000) >> 0x18 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff00000000) >> 8 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff000000) << 8 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff0000) << 0x18 |
                        ((ulong)in_stack_fffffffffffff740 & 0xff00) << 0x28 |
                       (long)in_stack_fffffffffffff740 << 0x38);
            docio_read_doc(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                           in_stack_fffffffffffff7e8,(bool)in_stack_fffffffffffff7e7);
            iVar1 = memcmp(local_6c8,local_198,(ulong)local_6e0);
            if (iVar1 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x4dd);
              initial_load_test_nested_common_prefix::__test_pass = 0;
              iVar1 = memcmp(local_6c8,local_198,(ulong)local_6e0);
              if (iVar1 != 0) {
                __assert_fail("!memcmp(doc.key, dockey, doc.length.keylen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x4dd,"void initial_load_test_nested_common_prefix()");
              }
            }
            iVar1 = memcmp(local_6b8,local_298,(ulong)local_6de);
            if (iVar1 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x4de);
              initial_load_test_nested_common_prefix::__test_pass = 0;
              iVar1 = memcmp(local_6b8,local_298,(ulong)local_6de);
              if (iVar1 != 0) {
                __assert_fail("!memcmp(doc.meta, meta, doc.length.metalen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x4de,"void initial_load_test_nested_common_prefix()");
              }
            }
            iVar1 = memcmp(local_6b0,local_398,(ulong)local_6dc);
            if (iVar1 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x4df);
              initial_load_test_nested_common_prefix::__test_pass = 0;
              iVar1 = memcmp(local_6b0,local_398,(ulong)local_6dc);
              if (iVar1 != 0) {
                __assert_fail("!memcmp(doc.body, body, doc.length.bodylen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x4df,"void initial_load_test_nested_common_prefix()");
              }
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    for (local_830 = 0; local_830 < 1000; local_830 = local_830 + 1) {
      sprintf(local_198,"00000000%08zu%08zuabc",local_828,local_830);
      sprintf(local_298,"metadata_%03zu",local_830);
      sprintf(local_398,"body_%03zu",local_830);
      local_8c = _set_doc((docio_object *)in_stack_fffffffffffff6f0,
                          (char *)in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0,
                          (char *)in_stack_fffffffffffff6d8);
      if (local_8c == 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x4b4);
        initial_load_test_nested_common_prefix::__test_pass = 0;
        if (local_8c == 0) {
          __assert_fail("docsize != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x4b4,"void initial_load_test_nested_common_prefix()");
        }
      }
      local_80 = docio_append_doc(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,'\0','\0');
      local_88 = (list_elem *)
                 (local_80 >> 0x38 | (local_80 & 0xff000000000000) >> 0x28 |
                  (local_80 & 0xff0000000000) >> 0x18 | (local_80 & 0xff00000000) >> 8 |
                  (local_80 & 0xff000000) << 8 | (local_80 & 0xff0000) << 0x18 |
                  (local_80 & 0xff00) << 0x28 | local_80 << 0x38);
      plVar2 = (list_elem *)malloc(0x28);
      plVar3 = (list_elem *)strlen(local_198);
      plVar2[1].next = plVar3;
      plVar3 = (list_elem *)malloc((size_t)plVar2[1].next);
      plVar2[1].prev = plVar3;
      memcpy(plVar2[1].prev,local_198,(size_t)plVar2[1].next);
      plVar2[2].prev = local_88;
      list_push_back((list *)local_820,plVar2);
    }
    local_828 = local_828 + 1;
  } while( true );
}

Assistant:

void initial_load_test_nested_common_prefix()
{
    TEST_INIT();

    int blocksize = 4096;
    uint64_t offset, _offset;
    uint32_t docsize;
    char dockey[256], meta[256], body[256];
    hbtrie_result r;

    int rr = system(SHELL_DEL " hbtrie_testfile");
    (void)rr;

    char keybuf[256], metabuf[256], bodybuf[256];
    struct docio_object doc;
    memset(&doc, 0, sizeof(struct docio_object));
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    struct filemgr_config config;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    struct filemgr *file = result.file;
    struct docio_handle dhandle;
    docio_init(&dhandle, file, false);

    struct btreeblk_handle bhandle;
    btreeblk_init(&bhandle, file, blocksize);

    struct list entries;
    list_init(&entries);
    for (size_t ii = 0; ii < 10; ++ii) {
        for (size_t jj = 0; jj < 1000; ++jj) {
            sprintf(dockey, "00000000%08zu%08zuabc", ii, jj);
            sprintf(meta, "metadata_%03zu", jj);
            sprintf(body, "body_%03zu", jj);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset = docio_append_doc(&dhandle, &doc, 0, 0);
            _offset = _endian_encode(offset);

            struct initial_load_elem* ile =
                (struct initial_load_elem*)malloc(sizeof(struct initial_load_elem));
            ile->keylen = strlen(dockey);
            ile->key = (uint8_t*)malloc(ile->keylen);
            memcpy(ile->key, dockey, ile->keylen);
            memcpy(ile->value, &_offset, sizeof(_offset));
            list_push_back(&entries, &ile->le);
        }
    }

    struct hbtrie trie;
    hbtrie_init_and_load(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                         (void*)&bhandle, btreeblk_get_ops(),
                         (void*)&dhandle, _readkey_wrap,
                         10000,
                         initial_load_next, initial_load_get, initial_btreeblk_end,
                         &entries);

    filemgr_commit(file, true, NULL);
    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    for (size_t ii = 0; ii < 10; ++ii) {
        for (size_t jj = 0; jj < 1000; ++jj) {
            sprintf(dockey, "00000000%08zu%08zuabc", ii, jj);
            sprintf(meta, "metadata_%03zu", jj);
            sprintf(body, "body_%03zu", jj);

            uint8_t valuebuf[8];
            r = hbtrie_find(&trie, (void*)dockey, strlen(dockey), (void*)valuebuf);
            btreeblk_end(&bhandle);
            TEST_CHK(r != HBTRIE_RESULT_FAIL);

            if (r != HBTRIE_RESULT_FAIL) {
                memcpy(&_offset, valuebuf, 8);
                _offset = _endian_decode(_offset);
                docio_read_doc(&dhandle, _offset, &doc, true);

                TEST_CHK(!memcmp(doc.key, dockey, doc.length.keylen));
                TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
                TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));
            }
        }
    }

    hbtrie_free(&trie);
    docio_free(&dhandle);
    btreeblk_free(&bhandle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    struct list_elem* le = list_begin(&entries);
    while (le) {
        struct initial_load_elem* ile =
            _get_entry(le, struct initial_load_elem, le);
        le = list_next(le);
        free(ile->key);
        free(ile);
    }

    TEST_RESULT("initial load with nested common prefix test");
}